

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteio.hpp
# Opt level: O3

void sf2cute::InsertInt32L<std::ostream>
               (basic_ostream<char,_std::char_traits<char>_> *out,uint32_t value)

{
  char local_14;
  char local_13;
  char local_12;
  char local_11;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_13,1);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_14,1);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_12,1);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_11,1);
  return;
}

Assistant:

void InsertInt32L(Insertable & out, uint32_t value) {
  out << static_cast<char>(value & 0xff);
  out << static_cast<char>((value >> 8) & 0xff);
  out << static_cast<char>((value >> 16) & 0xff);
  out << static_cast<char>((value >> 24) & 0xff);
}